

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::Var::Destroy(Var *this)

{
  if (this->type_ == Name) {
    std::__cxx11::string::_M_dispose();
    return;
  }
  return;
}

Assistant:

bool is_name() const { return type_ == VarType::Name; }